

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::merl::eval(merl *this,vec3 *wi,vec3 *wo,void *param_3)

{
  float fVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  value_type vVar11;
  float_t th;
  float_t pd;
  float_t td;
  float_t ph;
  undefined8 local_60;
  float local_58;
  vec3 local_50;
  vec3 local_40;
  
  if ((0.0 < wo->z) && (0.0 < *(float *)((long)param_3 + 8))) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    brdf::io_to_hd(wo,(vec3 *)param_3,&local_40,&local_50);
    xyz_to_theta_phi(&local_40,&th,&ph);
    xyz_to_theta_phi(&local_50,&td,&pd);
    iVar3 = (int)(((float)(~-(uint)(pd < 0.0) & (uint)pd |
                          (uint)(pd + 3.1415927) & -(uint)(pd < 0.0)) / 3.1415927) * 360.0 * 0.5);
    iVar4 = 0xb3;
    if (iVar3 < 0xb3) {
      iVar4 = iVar3;
    }
    iVar3 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar3;
    }
    iVar5 = (int)((td / 1.5707964) * 90.0);
    if (0x58 < iVar5) {
      iVar5 = 0x59;
    }
    if (iVar5 < 1) {
      iVar5 = iVar3;
    }
    if (0.0 < th) {
      fVar9 = (th / 1.5707964) * 90.0 * 90.0;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      iVar7 = 0x59;
      if ((int)fVar9 < 0x59) {
        iVar7 = (int)fVar9;
      }
      iVar3 = 0;
      if (0 < iVar7) {
        iVar3 = iVar7;
      }
      iVar3 = iVar3 * 0x3f48;
    }
    uVar8 = (ulong)(uint)(iVar5 * 0xb4 + iVar4 + iVar3);
    lVar2 = *(long *)&wi->z;
    fVar9 = (float)(*(double *)(lVar2 + uVar8 * 8) * 0.0006666666666666666);
    fVar10 = (float)(*(double *)(lVar2 + 0xb1fa80 + uVar8 * 8) * 0.0007666666666666666);
    if (((0.0 <= fVar9) && (0.0 <= fVar10)) &&
       (local_58 = (float)(*(double *)(lVar2 + 0x163f500 + uVar8 * 8) * 0.0011066666666666666),
       0.0 <= local_58)) {
      fVar1 = *(float *)((long)param_3 + 8);
      local_58 = local_58 * fVar1;
      local_60 = CONCAT44(fVar1 * fVar10,fVar1 * fVar9);
      std::valarray<float>::valarray((valarray<float> *)this,(float *)&local_60,3);
      pfVar6 = extraout_RDX;
      goto LAB_00146f9e;
    }
    fwrite("djb_verbose: below horizon\n",0x1b,1,_stdout);
  }
  (**(code **)(*(long *)wi + 0x10))(this,wi);
  pfVar6 = extraout_RDX_00;
LAB_00146f9e:
  vVar11._M_data = pfVar6;
  vVar11._M_size = (size_t)this;
  return vVar11;
}

Assistant:

brdf::value_type merl::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		// convert to half / diff angle coordinates
		vec3 wh, wd;
		float_t th, ph, td, pd;
		io_to_hd(wi, wo, &wh, &wd);
		xyz_to_theta_phi(wh, &th, &ph);
		xyz_to_theta_phi(wd, &td, &pd);

		// compute indexes
		int idx_r = phi_diff_index(pd)
		          + theta_diff_index(td)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          + theta_half_index(th)
		          * MERL_SAMPLING_RES_PHI_D / 2
		          * MERL_SAMPLING_RES_THETA_D;
		int idx_g = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D / 2;
		int idx_b = idx_r + MERL_SAMPLING_RES_THETA_H
		          * MERL_SAMPLING_RES_THETA_D
		          * MERL_SAMPLING_RES_PHI_D;

		// get color
		vec3 rgb;
		rgb.x = m_samples[idx_r] * MERL_RED_SCALE;
		rgb.y = m_samples[idx_g] * MERL_GREEN_SCALE;
		rgb.z = m_samples[idx_b] * MERL_BLUE_SCALE;

		if (rgb.x < 0 || rgb.y < 0 || rgb.z < 0) {
#ifndef NVERBOSE
			DJB_LOG("djb_verbose: below horizon\n");
#endif
			return zero_value();
		}
		rgb*= wo.z;

		return brdf::value_type(&rgb[0], 3);
	}

	return zero_value();
}